

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
handle_expired_timers_if_any
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  anon_class_8_1_8991fb9c local_18;
  
  (*((this->m_timer_manager)._M_t.
     super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>._M_t.
     super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>.
     super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl)->_vptr_timer_manager_t[2])
            ();
  if ((this->m_timers_collector).m_demands.
      super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_timers_collector).m_demands.
      super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_18.this = this;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::handle_expired_timers_if_any(std::unique_lock<std::mutex>&)::_lambda()_1_>
              (acquired_lock,&local_18);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::handle_expired_timers_if_any(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		// All expired timers must be collected.
		m_timer_manager->process_expired_timers();

		if( !m_timers_collector.empty() )
			// Actual handling of elapsed timers must be done
			// on unlocked env_infrastructure.
			// It is necessary because there can be an attempt to
			// deliver delayed/periodic messages into event_queue of
			// the default_dispatcher. But it is impossible to do if
			// env_infrastructure's mutex is locked.
			helpers::unlock_do_and_lock_again( acquired_lock,
				[this] {
					m_timers_collector.process();
				} );
	}